

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

CPubKey * __thiscall
wallet::LegacyScriptPubKeyMan::DeriveNewSeed(LegacyScriptPubKeyMan *this,CKey *key)

{
  undefined1 uVar1;
  byte bVar2;
  AnnotatedMixin<std::recursive_mutex> *pszName;
  runtime_error *this_00;
  undefined8 in_RDX;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  CPubKey *seed;
  int64_t nCreationTime;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock39;
  CKeyMetadata metadata;
  CKeyMetadata *in_stack_fffffffffffffe88;
  CKeyMetadata *in_stack_fffffffffffffe90;
  CKeyMetadata *in_stack_fffffffffffffe98;
  char *__rhs;
  undefined7 in_stack_fffffffffffffea0;
  key_type *in_stack_fffffffffffffea8;
  CKey *in_stack_fffffffffffffeb0;
  CPubKey *this_01;
  CKeyMetadata *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  char local_f1 [49];
  string local_c0 [52];
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined4 local_7c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  GetTime();
  CKeyMetadata::CKeyMetadata(in_stack_fffffffffffffeb8,(int64_t)in_stack_fffffffffffffeb0);
  CKey::GetPubKey(in_stack_fffffffffffffeb0);
  uVar1 = CKey::VerifyPubKey((CKey *)in_RDI,
                             (CPubKey *)
                             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  if (!(bool)uVar1) {
    __assert_fail("key.VerifyPubKey(seed)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x4c8,"CPubKey wallet::LegacyScriptPubKeyMan::DeriveNewSeed(const CKey &)");
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
  local_10 = 0;
  CPubKey::GetID((CPubKey *)in_stack_fffffffffffffeb0);
  local_38 = local_7c;
  local_48 = local_8c;
  uStack_40 = uStack_84;
  pszName = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                      ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RDI,
             (AnnotatedMixin<std::recursive_mutex> *)CONCAT17(uVar1,in_stack_fffffffffffffec0),
             (char *)pszName,&in_stack_fffffffffffffeb0->fCompressed,
             (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0));
  this_01 = (CPubKey *)(in_RSI + 0x40);
  CPubKey::GetID(this_01);
  std::
  map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
  ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                *)this_01,in_stack_fffffffffffffea8);
  CKeyMetadata::operator=(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  bVar2 = (**(code **)(*in_RSI + 0x118))(in_RSI,in_RDX,this_02);
  if ((bVar2 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __rhs = local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_02,(char *)in_RSI,(allocator<char> *)in_RDI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar2,in_stack_fffffffffffffea0),__rhs);
    std::runtime_error::runtime_error(this_00,local_c0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe88);
    CKeyMetadata::~CKeyMetadata(in_stack_fffffffffffffe88);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return (CPubKey *)in_RDI;
    }
  }
  __stack_chk_fail();
}

Assistant:

CPubKey LegacyScriptPubKeyMan::DeriveNewSeed(const CKey& key)
{
    int64_t nCreationTime = GetTime();
    CKeyMetadata metadata(nCreationTime);

    // calculate the seed
    CPubKey seed = key.GetPubKey();
    assert(key.VerifyPubKey(seed));

    // set the hd keypath to "s" -> Seed, refers the seed to itself
    metadata.hdKeypath     = "s";
    metadata.has_key_origin = false;
    metadata.hd_seed_id = seed.GetID();

    {
        LOCK(cs_KeyStore);

        // mem store the metadata
        mapKeyMetadata[seed.GetID()] = metadata;

        // write the key&metadata to the database
        if (!AddKeyPubKey(key, seed))
            throw std::runtime_error(std::string(__func__) + ": AddKeyPubKey failed");
    }

    return seed;
}